

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# General.cc
# Opt level: O0

void __thiscall
General_copyAssignable_Test::~General_copyAssignable_Test(General_copyAssignable_Test *this)

{
  void *in_RDI;
  
  ~General_copyAssignable_Test((General_copyAssignable_Test *)0x139658);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(General, copyAssignable)
{
  sigs::Signal<void()> s;
  s.connect([] {});
  s.connect([] {});
  s.setBlocked(true);

  decltype(s) s2;
  s2 = s;
  ASSERT_EQ(s2.size(), 2);
  ASSERT_TRUE(s2.blocked());
}